

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestSuite *this_00;
  TestInfo *pTVar1;
  bool bVar2;
  bool bVar3;
  reference ppTVar4;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *this_01;
  reference ppTVar5;
  bool local_1d9;
  byte local_1cf;
  byte local_1ce;
  bool local_1cd;
  bool local_1ca;
  int local_1b8;
  int local_1b4;
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string *test_name;
  TestInfo *test_info;
  iterator __end3;
  iterator __begin3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *__range3;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int local_148;
  int num_selected_tests;
  int num_runnable_tests;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [8];
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  int32_t shard_index;
  int32_t total_shards;
  ReactionToSharding shard_tests_local;
  UnitTestImpl *this_local;
  
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_1b4 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_1b8 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_1b4 = -1;
    local_1b8 = -1;
  }
  anon_unknown_28::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)
             &disable_test_filter.exact_match_patterns_._M_h._M_single_bucket,
             (string *)FLAGS_gtest_filter_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"DISABLED_*:*/DISABLED_*",&local_131);
  anon_unknown_28::UnitTestFilter::UnitTestFilter((UnitTestFilter *)local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  local_148 = 0;
  __range2._4_4_ = 0;
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     (&this->test_suites_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         (&this->test_suites_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                     *)&test_suite), bVar2) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppTVar4;
    TestSuite::set_should_run(this_00,false);
    this_01 = TestSuite::test_info_list(this_00);
    __end3 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin(this_01);
    test_info = (TestInfo *)
                std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end(this_01)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                                       *)&test_info), bVar2) {
      ppTVar5 = __gnu_cxx::
                __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                ::operator*(&__end3);
      pTVar1 = *ppTVar5;
      bVar2 = anon_unknown_28::UnitTestFilter::MatchesName
                        ((UnitTestFilter *)local_110,&this_00->name_);
      local_1ca = true;
      if (!bVar2) {
        local_1ca = anon_unknown_28::UnitTestFilter::MatchesName
                              ((UnitTestFilter *)local_110,&pTVar1->name_);
      }
      pTVar1->is_disabled_ = local_1ca;
      bVar2 = anon_unknown_28::PositiveAndNegativeUnitTestFilter::MatchesTest
                        ((PositiveAndNegativeUnitTestFilter *)
                         &disable_test_filter.exact_match_patterns_._M_h._M_single_bucket,
                         &this_00->name_,&pTVar1->name_);
      pTVar1->matches_filter_ = bVar2;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_1cd = false, local_1ca == false)) {
        local_1cd = bVar2;
      }
      local_1ce = 0;
      if (shard_tests != IGNORE_SHARDING_PROTOCOL) {
        bVar2 = ShouldRunTestOnShard(local_1b4,local_1b8,local_148);
        local_1ce = bVar2 ^ 0xff;
      }
      pTVar1->is_in_another_shard_ = (bool)(local_1ce & 1);
      local_1cf = 0;
      if (local_1cd != false) {
        local_1cf = local_1ce & 1 ^ 0xff;
      }
      bVar2 = (bool)(local_1cf & 1);
      local_148 = local_148 + (uint)local_1cd;
      __range2._4_4_ = __range2._4_4_ + (uint)bVar2;
      pTVar1->should_run_ = bVar2;
      bVar3 = TestSuite::should_run(this_00);
      local_1d9 = true;
      if (!bVar3) {
        local_1d9 = bVar2;
      }
      TestSuite::set_should_run(this_00,local_1d9);
      __gnu_cxx::
      __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  anon_unknown_28::UnitTestFilter::~UnitTestFilter((UnitTestFilter *)local_110);
  anon_unknown_28::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)
             &disable_test_filter.exact_match_patterns_._M_h._M_single_bucket);
  return __range2._4_4_;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    test_suite->set_should_run(false);

    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}